

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O1

bool __thiscall
YAML::EmitterState::SetStringFormat(EmitterState *this,EMITTER_MANIP value,value scope)

{
  bool bVar1;
  
  bVar1 = false;
  if ((value < LowerNull) && ((0x1c1U >> (value & EndMap) & 1) != 0)) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_strFmt,value,scope);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool EmitterState::SetStringFormat(EMITTER_MANIP value, FmtScope::value scope) {
  switch (value) {
    case Auto:
    case SingleQuoted:
    case DoubleQuoted:
    case Literal:
      _Set(m_strFmt, value, scope);
      return true;
    default:
      return false;
  }
}